

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::cleanupPagesNotInHistory(QWizardPrivate *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  QWizard *this_00;
  int *piVar4;
  QWizardPagePrivate *pQVar5;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  QWizardPagePrivate *page;
  QWizard *q;
  int idx;
  iterator end;
  iterator it;
  iterator *in_stack_ffffffffffffffb8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  QMap<int,_QWizardPage_*>::begin((QMap<int,_QWizardPage_*> *)this_00);
  QMap<int,_QWizardPage_*>::end((QMap<int,_QWizardPage_*> *)this_00);
  while( true ) {
    bVar3 = ::operator!=((iterator *)in_RDI,in_stack_ffffffffffffffb8);
    if (!bVar3) break;
    piVar4 = QMap<int,_QWizardPage_*>::iterator::key((iterator *)0x7b5142);
    iVar1 = *piVar4;
    QMap<int,_QWizardPage_*>::iterator::value((iterator *)0x7b5152);
    pQVar5 = QWizardPage::d_func((QWizardPage *)0x7b515a);
    if ((pQVar5->initialized & 1U) != 0) {
      bVar3 = QListSpecialMethodsBase<int>::contains<int>
                        ((QListSpecialMethodsBase<int> *)in_RDI,(int *)in_stack_ffffffffffffffb8);
      if (!bVar3) {
        (**(code **)(*(long *)&(this_00->super_QDialog).super_QWidget + 0x1e0))(this_00,iVar1);
        pQVar5->initialized = false;
      }
    }
    QMap<int,_QWizardPage_*>::iterator::operator++((iterator *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::cleanupPagesNotInHistory()
{
    Q_Q(QWizard);

    for (auto it = pageMap.begin(), end = pageMap.end(); it != end; ++it) {
        const auto idx = it.key();
        const auto page = it.value()->d_func();
        if (page->initialized && !history.contains(idx)) {
            q->cleanupPage(idx);
            page->initialized = false;
        }
    }
}